

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void relational_suite::compare_boolean_with_real_literal(void)

{
  undefined1 local_c59;
  basic_variable<std::allocator<char>_> local_c58;
  undefined1 local_c1b [2];
  undefined1 local_c19;
  basic_variable<std::allocator<char>_> local_c18;
  undefined1 local_bdb [2];
  undefined1 local_bd9;
  basic_variable<std::allocator<char>_> local_bd8;
  undefined1 local_b9b [2];
  undefined1 local_b99;
  basic_variable<std::allocator<char>_> local_b98;
  undefined1 local_b5b [2];
  undefined1 local_b59;
  basic_variable<std::allocator<char>_> local_b58;
  undefined1 local_b1b [2];
  undefined1 local_b19;
  basic_variable<std::allocator<char>_> local_b18;
  undefined1 local_adb [2];
  undefined1 local_ad9;
  basic_variable<std::allocator<char>_> local_ad8;
  undefined1 local_a9b [2];
  undefined1 local_a99;
  basic_variable<std::allocator<char>_> local_a98;
  undefined1 local_a5b [2];
  undefined1 local_a59;
  basic_variable<std::allocator<char>_> local_a58;
  undefined1 local_a1b [2];
  undefined1 local_a19;
  basic_variable<std::allocator<char>_> local_a18;
  undefined1 local_9db [2];
  undefined1 local_9d9;
  basic_variable<std::allocator<char>_> local_9d8;
  undefined1 local_99b [2];
  undefined1 local_999;
  basic_variable<std::allocator<char>_> local_998;
  undefined1 local_95b [2];
  undefined1 local_959;
  basic_variable<std::allocator<char>_> local_958;
  undefined1 local_91b [2];
  undefined1 local_919;
  basic_variable<std::allocator<char>_> local_918;
  undefined1 local_8db [2];
  undefined1 local_8d9;
  basic_variable<std::allocator<char>_> local_8d8;
  undefined1 local_89b [2];
  undefined1 local_899;
  basic_variable<std::allocator<char>_> local_898;
  undefined1 local_85a [2];
  undefined1 auStack_858 [8];
  longdouble one_2;
  longdouble zero_2;
  undefined1 local_829;
  basic_variable<std::allocator<char>_> local_828;
  undefined1 local_7eb [2];
  undefined1 local_7e9;
  basic_variable<std::allocator<char>_> local_7e8;
  undefined1 local_7ab [2];
  undefined1 local_7a9;
  basic_variable<std::allocator<char>_> local_7a8;
  undefined1 local_76b [2];
  undefined1 local_769;
  basic_variable<std::allocator<char>_> local_768;
  undefined1 local_72b [2];
  undefined1 local_729;
  basic_variable<std::allocator<char>_> local_728;
  undefined1 local_6eb [2];
  undefined1 local_6e9;
  basic_variable<std::allocator<char>_> local_6e8;
  undefined1 local_6ab [2];
  undefined1 local_6a9;
  basic_variable<std::allocator<char>_> local_6a8;
  undefined1 local_66b [2];
  undefined1 local_669;
  basic_variable<std::allocator<char>_> local_668;
  undefined1 local_62b [2];
  undefined1 local_629;
  basic_variable<std::allocator<char>_> local_628;
  undefined1 local_5eb [2];
  undefined1 local_5e9;
  basic_variable<std::allocator<char>_> local_5e8;
  undefined1 local_5ab [2];
  undefined1 local_5a9;
  basic_variable<std::allocator<char>_> local_5a8;
  undefined1 local_56b [2];
  undefined1 local_569;
  basic_variable<std::allocator<char>_> local_568;
  undefined1 local_52b [2];
  undefined1 local_529;
  basic_variable<std::allocator<char>_> local_528;
  undefined1 local_4eb [2];
  undefined1 local_4e9;
  basic_variable<std::allocator<char>_> local_4e8;
  undefined1 local_4ab [2];
  undefined1 local_4a9;
  basic_variable<std::allocator<char>_> local_4a8;
  undefined1 local_46b [2];
  undefined1 local_469;
  basic_variable<std::allocator<char>_> local_468;
  undefined1 local_432 [2];
  double local_430;
  double one_1;
  double zero_1;
  basic_variable<std::allocator<char>_> local_418;
  undefined1 local_3db [2];
  undefined1 local_3d9;
  basic_variable<std::allocator<char>_> local_3d8;
  undefined1 local_39b [2];
  undefined1 local_399;
  basic_variable<std::allocator<char>_> local_398;
  undefined1 local_35b [2];
  undefined1 local_359;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31b [2];
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  undefined1 local_2db [2];
  undefined1 local_2d9;
  basic_variable<std::allocator<char>_> local_2d8;
  undefined1 local_29b [2];
  undefined1 local_299;
  basic_variable<std::allocator<char>_> local_298;
  undefined1 local_25b [2];
  undefined1 local_259;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 local_21b [2];
  undefined1 local_219;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1db [2];
  undefined1 local_1d9;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_19b [2];
  undefined1 local_199;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11b [2];
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9b [2];
  undefined1 local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [21];
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_12 [2];
  float local_10;
  float local_c;
  float one;
  float zero;
  
  local_c = 0.0;
  local_10 = 1.0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_48,false);
  local_12[0] = trial::dynamic::operator<(&local_48,&local_c);
  local_49 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) < zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11a4,"void relational_suite::compare_boolean_with_real_literal()",local_12,&local_49
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_98,false);
  local_5e[0] = trial::dynamic::operator<=(&local_98,&local_c);
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) <= zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11a5,"void relational_suite::compare_boolean_with_real_literal()",local_5e,&local_99
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_d8,false);
  local_9b[0] = trial::dynamic::operator>(&local_d8,&local_c);
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) > zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11a6,"void relational_suite::compare_boolean_with_real_literal()",local_9b,&local_d9
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_118,false);
  local_db[0] = trial::dynamic::operator>=(&local_118,&local_c);
  local_119 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) >= zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11a7,"void relational_suite::compare_boolean_with_real_literal()",local_db,
             &local_119);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_158,false);
  local_11b[0] = trial::dynamic::operator<(&local_158,&local_10);
  local_159 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) < one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11a9,"void relational_suite::compare_boolean_with_real_literal()",local_11b,
             &local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_198,false);
  local_15b[0] = trial::dynamic::operator<=(&local_198,&local_10);
  local_199 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) <= one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11aa,"void relational_suite::compare_boolean_with_real_literal()",local_15b,
             &local_199);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_1d8,false);
  local_19b[0] = trial::dynamic::operator>(&local_1d8,&local_10);
  local_1d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) > one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11ab,"void relational_suite::compare_boolean_with_real_literal()",local_19b,
             &local_1d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_218,false);
  local_1db[0] = trial::dynamic::operator>=(&local_218,&local_10);
  local_219 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) >= one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11ac,"void relational_suite::compare_boolean_with_real_literal()",local_1db,
             &local_219);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_258,true);
  local_21b[0] = trial::dynamic::operator<(&local_258,&local_c);
  local_259 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) < zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11ae,"void relational_suite::compare_boolean_with_real_literal()",local_21b,
             &local_259);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_298,true);
  local_25b[0] = trial::dynamic::operator<=(&local_298,&local_c);
  local_299 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) <= zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11af,"void relational_suite::compare_boolean_with_real_literal()",local_25b,
             &local_299);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_2d8,true);
  local_29b[0] = trial::dynamic::operator>(&local_2d8,&local_c);
  local_2d9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) > zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11b0,"void relational_suite::compare_boolean_with_real_literal()",local_29b,
             &local_2d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_318,true);
  local_2db[0] = trial::dynamic::operator>=(&local_318,&local_c);
  local_319 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) >= zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11b1,"void relational_suite::compare_boolean_with_real_literal()",local_2db,
             &local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_358,true);
  local_31b[0] = trial::dynamic::operator<(&local_358,&local_10);
  local_359 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) < one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11b3,"void relational_suite::compare_boolean_with_real_literal()",local_31b,
             &local_359);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_398,true);
  local_35b[0] = trial::dynamic::operator<=(&local_398,&local_10);
  local_399 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) <= one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11b4,"void relational_suite::compare_boolean_with_real_literal()",local_35b,
             &local_399);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_398);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_3d8,true);
  local_39b[0] = trial::dynamic::operator>(&local_3d8,&local_10);
  local_3d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) > one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11b5,"void relational_suite::compare_boolean_with_real_literal()",local_39b,
             &local_3d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_418,true);
  local_3db[0] = trial::dynamic::operator>=(&local_418,&local_10);
  zero_1._7_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) >= one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11b6,"void relational_suite::compare_boolean_with_real_literal()",local_3db,
             (long)&zero_1 + 7);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_418);
  one_1 = 0.0;
  local_430 = 1.0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_468,false);
  local_432[0] = trial::dynamic::operator<(&local_468,&one_1);
  local_469 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) < zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11bc,"void relational_suite::compare_boolean_with_real_literal()",local_432,
             &local_469);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_468);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_4a8,false);
  local_46b[0] = trial::dynamic::operator<=(&local_4a8,&one_1);
  local_4a9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) <= zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11bd,"void relational_suite::compare_boolean_with_real_literal()",local_46b,
             &local_4a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_4e8,false);
  local_4ab[0] = trial::dynamic::operator>(&local_4e8,&one_1);
  local_4e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) > zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11be,"void relational_suite::compare_boolean_with_real_literal()",local_4ab,
             &local_4e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_528,false);
  local_4eb[0] = trial::dynamic::operator>=(&local_528,&one_1);
  local_529 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) >= zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11bf,"void relational_suite::compare_boolean_with_real_literal()",local_4eb,
             &local_529);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_528);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_568,false);
  local_52b[0] = trial::dynamic::operator<(&local_568,&local_430);
  local_569 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) < one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11c1,"void relational_suite::compare_boolean_with_real_literal()",local_52b,
             &local_569);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_568);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_5a8,false);
  local_56b[0] = trial::dynamic::operator<=(&local_5a8,&local_430);
  local_5a9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) <= one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11c2,"void relational_suite::compare_boolean_with_real_literal()",local_56b,
             &local_5a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_5e8,false);
  local_5ab[0] = trial::dynamic::operator>(&local_5e8,&local_430);
  local_5e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) > one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11c3,"void relational_suite::compare_boolean_with_real_literal()",local_5ab,
             &local_5e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_628,false);
  local_5eb[0] = trial::dynamic::operator>=(&local_628,&local_430);
  local_629 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) >= one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11c4,"void relational_suite::compare_boolean_with_real_literal()",local_5eb,
             &local_629);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_628);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_668,true);
  local_62b[0] = trial::dynamic::operator<(&local_668,&one_1);
  local_669 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) < zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11c6,"void relational_suite::compare_boolean_with_real_literal()",local_62b,
             &local_669);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_668);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_6a8,true);
  local_66b[0] = trial::dynamic::operator<=(&local_6a8,&one_1);
  local_6a9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) <= zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11c7,"void relational_suite::compare_boolean_with_real_literal()",local_66b,
             &local_6a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_6e8,true);
  local_6ab[0] = trial::dynamic::operator>(&local_6e8,&one_1);
  local_6e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) > zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11c8,"void relational_suite::compare_boolean_with_real_literal()",local_6ab,
             &local_6e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_728,true);
  local_6eb[0] = trial::dynamic::operator>=(&local_728,&one_1);
  local_729 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) >= zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11c9,"void relational_suite::compare_boolean_with_real_literal()",local_6eb,
             &local_729);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_728);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_768,true);
  local_72b[0] = trial::dynamic::operator<(&local_768,&local_430);
  local_769 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) < one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11cb,"void relational_suite::compare_boolean_with_real_literal()",local_72b,
             &local_769);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_768);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_7a8,true);
  local_76b[0] = trial::dynamic::operator<=(&local_7a8,&local_430);
  local_7a9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) <= one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11cc,"void relational_suite::compare_boolean_with_real_literal()",local_76b,
             &local_7a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_7e8,true);
  local_7ab[0] = trial::dynamic::operator>(&local_7e8,&local_430);
  local_7e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) > one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11cd,"void relational_suite::compare_boolean_with_real_literal()",local_7ab,
             &local_7e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_828,true);
  local_7eb[0] = trial::dynamic::operator>=(&local_828,&local_430);
  local_829 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) >= one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11ce,"void relational_suite::compare_boolean_with_real_literal()",local_7eb,
             &local_829);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_828);
  unique0x00076c00 = (longdouble)0;
  _auStack_858 = (longdouble)1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_898,false);
  local_85a[0] = trial::dynamic::operator<(&local_898,(longdouble *)((long)&one_2 + 8));
  local_899 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) < zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11d4,"void relational_suite::compare_boolean_with_real_literal()",local_85a,
             &local_899);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_898);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_8d8,false);
  local_89b[0] = trial::dynamic::operator<=(&local_8d8,(longdouble *)((long)&one_2 + 8));
  local_8d9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) <= zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11d5,"void relational_suite::compare_boolean_with_real_literal()",local_89b,
             &local_8d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_918,false);
  local_8db[0] = trial::dynamic::operator>(&local_918,(longdouble *)((long)&one_2 + 8));
  local_919 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) > zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11d6,"void relational_suite::compare_boolean_with_real_literal()",local_8db,
             &local_919);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_918);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_958,false);
  local_91b[0] = trial::dynamic::operator>=(&local_958,(longdouble *)((long)&one_2 + 8));
  local_959 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) >= zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11d7,"void relational_suite::compare_boolean_with_real_literal()",local_91b,
             &local_959);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_958);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_998,false);
  local_95b[0] = trial::dynamic::operator<(&local_998,(longdouble *)auStack_858);
  local_999 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) < one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11d9,"void relational_suite::compare_boolean_with_real_literal()",local_95b,
             &local_999);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_998);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_9d8,false);
  local_99b[0] = trial::dynamic::operator<=(&local_9d8,(longdouble *)auStack_858);
  local_9d9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) <= one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11da,"void relational_suite::compare_boolean_with_real_literal()",local_99b,
             &local_9d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_a18,false);
  local_9db[0] = trial::dynamic::operator>(&local_a18,(longdouble *)auStack_858);
  local_a19 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) > one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11db,"void relational_suite::compare_boolean_with_real_literal()",local_9db,
             &local_a19);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a18);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_a58,false);
  local_a1b[0] = trial::dynamic::operator>=(&local_a58,(longdouble *)auStack_858);
  local_a59 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(false) >= one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11dc,"void relational_suite::compare_boolean_with_real_literal()",local_a1b,
             &local_a59);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a58);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_a98,true);
  local_a5b[0] = trial::dynamic::operator<(&local_a98,(longdouble *)((long)&one_2 + 8));
  local_a99 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) < zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11de,"void relational_suite::compare_boolean_with_real_literal()",local_a5b,
             &local_a99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_ad8,true);
  local_a9b[0] = trial::dynamic::operator<=(&local_ad8,(longdouble *)((long)&one_2 + 8));
  local_ad9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) <= zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11df,"void relational_suite::compare_boolean_with_real_literal()",local_a9b,
             &local_ad9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_ad8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_b18,true);
  local_adb[0] = trial::dynamic::operator>(&local_b18,(longdouble *)((long)&one_2 + 8));
  local_b19 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) > zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11e0,"void relational_suite::compare_boolean_with_real_literal()",local_adb,
             &local_b19);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b18);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_b58,true);
  local_b1b[0] = trial::dynamic::operator>=(&local_b58,(longdouble *)((long)&one_2 + 8));
  local_b59 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) >= zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11e1,"void relational_suite::compare_boolean_with_real_literal()",local_b1b,
             &local_b59);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b58);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_b98,true);
  local_b5b[0] = trial::dynamic::operator<(&local_b98,(longdouble *)auStack_858);
  local_b99 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) < one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11e3,"void relational_suite::compare_boolean_with_real_literal()",local_b5b,
             &local_b99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_bd8,true);
  local_b9b[0] = trial::dynamic::operator<=(&local_bd8,(longdouble *)auStack_858);
  local_bd9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) <= one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11e4,"void relational_suite::compare_boolean_with_real_literal()",local_b9b,
             &local_bd9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_bd8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_c18,true);
  local_bdb[0] = trial::dynamic::operator>(&local_c18,(longdouble *)auStack_858);
  local_c19 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) > one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11e5,"void relational_suite::compare_boolean_with_real_literal()",local_bdb,
             &local_c19);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c18);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_c58,true);
  local_c1b[0] = trial::dynamic::operator>=(&local_c58,(longdouble *)auStack_858);
  local_c59 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(true) >= one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x11e6,"void relational_suite::compare_boolean_with_real_literal()",local_c1b,
             &local_c59);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c58);
  return;
}

Assistant:

void compare_boolean_with_real_literal()
{
    {
        const float zero = 0.0f;
        const float one = 1.0f;

        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) < zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) <= zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) > zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) >= zero, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) < one, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) <= one, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) > one, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) >= one, false);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) < zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) <= zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) > zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) >= zero, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) < one, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) <= one, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) > one, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) >= one, true);
    }
    {
        const double zero = 0.0;
        const double one = 1.0;

        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) < zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) <= zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) > zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) >= zero, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) < one, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) <= one, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) > one, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) >= one, false);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) < zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) <= zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) > zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) >= zero, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) < one, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) <= one, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) > one, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) >= one, true);
    }
    {
        const long double zero = 0.0L;
        const long double one = 1.0L;

        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) < zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) <= zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) > zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) >= zero, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) < one, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) <= one, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) > one, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(false) >= one, false);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) < zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) <= zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) > zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) >= zero, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) < one, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) <= one, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) > one, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(true) >= one, true);
    }
}